

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_image_section_cache.c
# Opt level: O3

int pt_iscache_find(pt_image_section_cache *iscache,char *filename,uint64_t offset,uint64_t size,
                   uint64_t laddr)

{
  ushort uVar1;
  pt_iscache_entry *ppVar2;
  pt_section *section;
  int iVar3;
  int iVar4;
  int iVar5;
  char *__s1;
  uint64_t uVar6;
  uint64_t uVar7;
  long lVar8;
  
  if (iscache == (pt_image_section_cache *)0x0) {
    iVar4 = -1;
  }
  else {
    iVar3 = mtx_lock(&iscache->lock);
    iVar4 = -0x12;
    if (iVar3 == 0) {
      iVar3 = -1;
      if (filename != (char *)0x0) {
        uVar1 = iscache->size;
        if (uVar1 == 0) {
          iVar3 = 0;
        }
        else {
          iVar3 = 1;
          lVar8 = 0;
          do {
            ppVar2 = iscache->entries;
            section = *(pt_section **)((long)&ppVar2->section + lVar8);
            __s1 = pt_section_filename(section);
            uVar6 = pt_section_offset(section);
            uVar7 = pt_section_size(section);
            if (((*(uint64_t *)((long)&ppVar2->laddr + lVar8) == laddr) && (uVar6 == offset)) &&
               (uVar7 == size)) {
              if (__s1 == (char *)0x0) {
                iVar3 = -1;
                goto LAB_0010b4bd;
              }
              iVar4 = strcmp(__s1,filename);
              if (iVar4 == 0) goto LAB_0010b4bd;
            }
            iVar3 = iVar3 + 1;
            lVar8 = lVar8 + 0x10;
          } while ((ulong)uVar1 << 4 != lVar8);
          iVar3 = 0;
        }
      }
LAB_0010b4bd:
      iVar5 = mtx_unlock(&iscache->lock);
      iVar4 = -0x12;
      if (iVar5 == 0) {
        iVar4 = iVar3;
      }
    }
  }
  return iVar4;
}

Assistant:

int pt_iscache_find(struct pt_image_section_cache *iscache,
		    const char *filename, uint64_t offset, uint64_t size,
		    uint64_t laddr)
{
	int errcode, isid;

	errcode = pt_iscache_lock(iscache);
	if (errcode < 0)
		return errcode;

	isid = pt_iscache_find_locked(iscache, filename, offset, size, laddr);

	errcode = pt_iscache_unlock(iscache);
	if (errcode < 0)
		return errcode;

	return isid;
}